

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_parser_t * mpc_re_mode(char *re,int mode)

{
  int iVar1;
  mpc_parser_t *pmVar2;
  mpc_parser_t *pmVar3;
  mpc_parser_t *pmVar4;
  mpc_parser_t *pmVar5;
  mpc_parser_t *pmVar6;
  mpc_parser_t *pmVar7;
  mpc_parser_t *pmVar8;
  char *__ptr;
  mpc_result_t mVar9;
  mpc_result_t r;
  mpc_parser_t *local_68;
  int mode_local;
  mpc_parser_t *local_58;
  mpc_parser_t *local_50;
  mpc_parser_t *local_48;
  mpc_parser_t *local_40;
  char *local_38;
  
  mode_local = mode;
  local_38 = re;
  pmVar2 = mpc_new("regex");
  pmVar3 = mpc_new("term");
  local_48 = pmVar3;
  pmVar4 = mpc_new("factor");
  local_68 = mpc_new("base");
  local_40 = mpc_new("range");
  pmVar5 = mpc_char('|');
  pmVar5 = mpc_and(2,mpcf_snd_free,pmVar5,pmVar2,free);
  pmVar5 = mpc_maybe(pmVar5);
  pmVar5 = mpc_and(2,mpcf_re_or,pmVar3,pmVar5,mpc_delete);
  local_58 = pmVar2;
  mpc_define(pmVar2,pmVar5);
  local_50 = pmVar4;
  pmVar5 = mpc_many(mpcf_re_and,pmVar4);
  mpc_define(pmVar3,pmVar5);
  pmVar3 = mpc_char('*');
  pmVar5 = mpc_char('+');
  pmVar6 = mpc_char('?');
  pmVar7 = mpc_int();
  pmVar7 = mpc_brackets(pmVar7,free);
  pmVar8 = mpc_pass();
  pmVar3 = mpc_or(5,pmVar3,pmVar5,pmVar6,pmVar7,pmVar8);
  pmVar3 = mpc_and(2,mpcf_re_repeat,local_68,pmVar3,mpc_delete);
  mpc_define(pmVar4,pmVar3);
  pmVar2 = mpc_parens(pmVar2,mpc_delete);
  pmVar6 = local_40;
  pmVar3 = mpc_squares(local_40,mpc_delete);
  pmVar4 = mpc_escape();
  pmVar7 = mpc_apply_to(pmVar4,mpcf_re_escape,&mode_local);
  pmVar4 = mpc_noneof(")|");
  pmVar8 = mpc_apply_to(pmVar4,mpcf_re_escape,&mode_local);
  pmVar5 = local_48;
  pmVar4 = local_50;
  pmVar3 = mpc_or(4,pmVar2,pmVar3,pmVar7,pmVar8);
  pmVar2 = local_68;
  mpc_define(local_68,pmVar3);
  pmVar3 = mpc_escape();
  pmVar7 = mpc_noneof("]");
  pmVar3 = mpc_or(2,pmVar3,pmVar7);
  pmVar3 = mpc_many(mpcf_strfold,pmVar3);
  pmVar3 = mpc_apply(pmVar3,mpcf_re_range);
  mpc_define(pmVar6,pmVar3);
  pmVar3 = local_58;
  pmVar7 = mpc_predictive(local_58);
  pmVar7 = mpc_whole(pmVar7,mpc_delete);
  mpc_optimise(pmVar7);
  mpc_optimise(pmVar3);
  mpc_optimise(pmVar5);
  mpc_optimise(pmVar4);
  mpc_optimise(pmVar2);
  mpc_optimise(pmVar6);
  iVar1 = mpc_parse("<mpc_re_compiler>",local_38,pmVar7,&r);
  if (iVar1 == 0) {
    __ptr = mpc_err_string(r.error);
    mVar9.error = (mpc_err_t *)mpc_failf("Invalid Regex: %s",__ptr);
    mpc_err_delete(r.error);
    pmVar2 = local_68;
    free(__ptr);
    r.error = mVar9.error;
  }
  mpc_cleanup(6,pmVar7,local_58,pmVar5,pmVar4,pmVar2,pmVar6);
  mpc_optimise((mpc_parser_t *)r.error);
  return (mpc_parser_t *)r.error;
}

Assistant:

mpc_parser_t *mpc_re_mode(const char *re, int mode) {

  char *err_msg;
  mpc_parser_t *err_out;
  mpc_result_t r;
  mpc_parser_t *Regex, *Term, *Factor, *Base, *Range, *RegexEnclose;

  Regex  = mpc_new("regex");
  Term   = mpc_new("term");
  Factor = mpc_new("factor");
  Base   = mpc_new("base");
  Range  = mpc_new("range");

  mpc_define(Regex, mpc_and(2, mpcf_re_or,
    Term,
    mpc_maybe(mpc_and(2, mpcf_snd_free, mpc_char('|'), Regex, free)),
    (mpc_dtor_t)mpc_delete
  ));

  mpc_define(Term, mpc_many(mpcf_re_and, Factor));

  mpc_define(Factor, mpc_and(2, mpcf_re_repeat,
    Base,
    mpc_or(5,
      mpc_char('*'), mpc_char('+'), mpc_char('?'),
      mpc_brackets(mpc_int(), free),
      mpc_pass()),
    (mpc_dtor_t)mpc_delete
  ));

  mpc_define(Base, mpc_or(4,
    mpc_parens(Regex, (mpc_dtor_t)mpc_delete),
    mpc_squares(Range, (mpc_dtor_t)mpc_delete),
    mpc_apply_to(mpc_escape(), mpcf_re_escape, &mode),
    mpc_apply_to(mpc_noneof(")|"), mpcf_re_escape, &mode)
  ));

  mpc_define(Range, mpc_apply(
    mpc_many(mpcf_strfold, mpc_or(2, mpc_escape(), mpc_noneof("]"))),
    mpcf_re_range
  ));

  RegexEnclose = mpc_whole(mpc_predictive(Regex), (mpc_dtor_t)mpc_delete);

  mpc_optimise(RegexEnclose);
  mpc_optimise(Regex);
  mpc_optimise(Term);
  mpc_optimise(Factor);
  mpc_optimise(Base);
  mpc_optimise(Range);

  if(!mpc_parse("<mpc_re_compiler>", re, RegexEnclose, &r)) {
    err_msg = mpc_err_string(r.error);
    err_out = mpc_failf("Invalid Regex: %s", err_msg);
    mpc_err_delete(r.error);
    free(err_msg);
    r.output = err_out;
  }

  mpc_cleanup(6, RegexEnclose, Regex, Term, Factor, Base, Range);

  mpc_optimise(r.output);

  return r.output;

}